

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalSerialize
          (CodeGeneratorResponse *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined8 *puVar4;
  Type *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int index;
  uint8_t *puVar8;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)((ulong)(this->error_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar4,*(int *)(puVar4 + 1),SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorResponse.error");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->error_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  puVar8 = target;
  if ((uVar1 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = this->supported_features_;
    *target = '\x10';
    target[1] = (byte)uVar5;
    if (uVar5 < 0x80) {
      puVar8 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      target[2] = (uint8_t)(uVar5 >> 7);
      puVar8 = target + 3;
      if (0x3fff < uVar5) {
        uVar7 = (ulong)target[2];
        uVar5 = uVar5 >> 7;
        do {
          puVar8[-1] = (byte)uVar7 | 0x80;
          uVar6 = uVar5 >> 7;
          *puVar8 = (uint8_t)uVar6;
          puVar8 = puVar8 + 1;
          uVar7 = uVar6 & 0xffffffff;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar3);
      }
    }
  }
  iVar2 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    index = 0;
    do {
      if (stream->end_ <= puVar8) {
        puVar8 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar8);
      }
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                          (&(this->file_).super_RepeatedPtrFieldBase,index);
      *puVar8 = 'z';
      uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      puVar8[1] = (uint8_t)uVar1;
      if (uVar1 < 0x80) {
        puVar8 = puVar8 + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper(uVar1,puVar8 + 1);
      }
      puVar8 = CodeGeneratorResponse_File::_InternalSerialize(this_00,puVar8,stream);
      index = index + 1;
    } while (iVar2 != index);
  }
  uVar5 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    puVar8 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar5 & 0xfffffffffffffffc) + 8),puVar8,stream);
    return puVar8;
  }
  return puVar8;
}

Assistant:

uint8_t* CodeGeneratorResponse::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorResponse)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string error = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_error().data(), static_cast<int>(this->_internal_error().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorResponse.error");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_error(), target);
  }

  // optional uint64 supported_features = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(2, this->_internal_supported_features(), target);
  }

  // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_file_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(15, this->_internal_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorResponse)
  return target;
}